

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O0

int NULLCPugiXML::xml_node__traverse
              (NULLCFuncPtr begin,NULLCFuncPtr for_each,NULLCFuncPtr end,xml_node *ptr)

{
  bool bVar1;
  undefined1 local_98 [8];
  xml_tree_walker walker;
  NULLCFuncPtr end_local;
  NULLCFuncPtr for_each_local;
  NULLCFuncPtr begin_local;
  
  walker.endCB._4_8_ = end.context;
  xml_tree_walker::xml_tree_walker((xml_tree_walker *)local_98,begin,for_each,end);
  bVar1 = pugi::xml_node::traverse(&ptr->node,(xml_tree_walker *)local_98);
  xml_tree_walker::~xml_tree_walker((xml_tree_walker *)local_98);
  return (uint)bVar1;
}

Assistant:

int xml_node__traverse(NULLCFuncPtr begin, NULLCFuncPtr for_each, NULLCFuncPtr end, xml_node* ptr)
	{
		xml_tree_walker walker = xml_tree_walker(begin, for_each, end);
		return ptr->node.traverse(walker);
	}